

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

bool __thiscall
lunasvg::SVGPatternElement::applyPaint(SVGPatternElement *this,SVGRenderState *state,float opacity)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  float extraout_XMM0_Da;
  float sx;
  float sy;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  float sx_00;
  float in_XMM1_Db;
  float sy_00;
  shared_ptr<lunasvg::Canvas> patternImage;
  Transform patternImageTransform;
  Transform patternTransform;
  SVGPatternAttributes attributes;
  LengthContext lengthContext;
  Transform currentTransform;
  float local_15c;
  float local_158;
  Canvas local_148;
  float local_128;
  plutovg_matrix_t local_110;
  Transform local_f8;
  SVGPatternAttributes local_e0;
  SVGRenderState local_90;
  LengthContext local_50;
  Transform local_40;
  
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (bVar1) {
    return false;
  }
  collectPatternAttributes(&local_e0,this);
  bVar1 = local_e0.m_patternContentElement != (SVGPatternElement *)0x0;
  if (local_e0.m_patternContentElement == (SVGPatternElement *)0x0) {
    return bVar1;
  }
  local_50.m_units = ((local_e0.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9;
  local_50.m_element = (SVGElement *)this;
  local_158 = LengthContext::valueForLength
                        (&local_50,(Length *)&((local_e0.m_x)->m_x).super_SVGProperty.field_0xc,
                         ((local_e0.m_x)->m_x).super_SVGProperty.field_0x9);
  local_15c = LengthContext::valueForLength
                        (&local_50,(Length *)&((local_e0.m_y)->m_y).super_SVGProperty.field_0xc,
                         ((local_e0.m_y)->m_y).super_SVGProperty.field_0x9);
  local_128 = LengthContext::valueForLength
                        (&local_50,
                         (Length *)&((local_e0.m_width)->m_width).super_SVGProperty.field_0xc,
                         ((local_e0.m_width)->m_width).super_SVGProperty.field_0x9);
  local_148.m_x =
       (int)LengthContext::valueForLength
                      (&local_50,
                       (Length *)&((local_e0.m_height)->m_height).super_SVGProperty.field_0xc,
                       ((local_e0.m_height)->m_height).super_SVGProperty.field_0x9);
  if (((local_e0.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9 == '\x01') {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    local_158 = local_158 * in_XMM1_Da + extraout_XMM0_Da;
    local_128 = local_128 * in_XMM1_Da;
    local_15c = local_15c * in_XMM1_Db + extraout_XMM0_Db;
    local_148.m_x = (int)((float)local_148.m_x * in_XMM1_Db);
  }
  Transform::operator*
            (&local_40,
             (Transform *)
             &((local_e0.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc,
             &state->m_currentTransform);
  sx = Transform::xScale(&local_40);
  sy = Transform::yScale(&local_40);
  Canvas::create(&local_148,0.0,0.0,local_128 * sx,(float)local_148.m_x * sy);
  sy_00 = 0.0;
  sx_00 = sy;
  Transform::scaled((Transform *)&local_110,sx,sy);
  if (0.0 <= *(float *)&((local_e0.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x14) {
    sx_00 = 0.0;
    sy_00 = 0.0;
    if (0.0 <= *(float *)&((local_e0.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x18) {
      local_f8.m_matrix.b = (float)local_148.m_x;
      local_f8.m_matrix.a = local_128;
      SVGPreserveAspectRatio::getTransform
                ((Transform *)&local_90,
                 &((local_e0.m_preserveAspectRatio)->super_SVGFitToViewBox).m_preserveAspectRatio,
                 (Rect *)&((local_e0.m_viewBox)->super_SVGFitToViewBox).m_viewBox.super_SVGProperty.
                          field_0xc,(Size *)&local_f8);
      Transform::multiply((Transform *)&local_110,(Transform *)&local_90);
      goto LAB_00118ce9;
    }
  }
  if (((local_e0.m_patternContentUnits)->m_patternContentUnits).super_SVGProperty.field_0x9 ==
      '\x01') {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    Transform::scale((Transform *)&local_110,sx_00,sy_00);
  }
LAB_00118ce9:
  if (local_148.m_canvas != (plutovg_canvas_t *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_148.m_canvas)->surface = *(int *)&(local_148.m_canvas)->surface + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_148.m_canvas)->surface = *(int *)&(local_148.m_canvas)->surface + 1;
    }
  }
  local_90.m_currentTransform.m_matrix.a = local_110.a;
  local_90.m_currentTransform.m_matrix.b = local_110.b;
  local_90.m_currentTransform.m_matrix.c = local_110.c;
  local_90.m_currentTransform.m_matrix.d = local_110.d;
  local_90.m_currentTransform.m_matrix.e = local_110.e;
  local_90.m_currentTransform.m_matrix.f = local_110.f;
  local_90.m_mode = Painting;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148.m_surface;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_canvas;
  local_90.m_element = (SVGElement *)this;
  local_90.m_parent = state;
  SVGElement::renderChildren((SVGElement *)local_e0.m_patternContentElement,&local_90);
  local_f8.m_matrix._0_8_ =
       *(undefined8 *)
        &((local_e0.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc;
  local_f8.m_matrix.c = *(float *)&((local_e0.m_patternTransform)->m_patternTransform).field_0x14;
  local_f8.m_matrix.d = *(float *)&((local_e0.m_patternTransform)->m_patternTransform).field_0x18;
  local_f8.m_matrix.e = *(float *)&((local_e0.m_patternTransform)->m_patternTransform).field_0x1c;
  local_f8.m_matrix.f = *(float *)&((local_e0.m_patternTransform)->m_patternTransform).field_0x20;
  Transform::translate(&local_f8,local_158,local_15c);
  Transform::scale(&local_f8,1.0 / sx,1.0 / sy);
  Canvas::setTexture((state->m_canvas).
                     super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (Canvas *)local_148.m_surface,Tiled,opacity,&local_f8);
  if ((plutovg_canvas_t *)
      local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (plutovg_canvas_t *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_148.m_canvas != (plutovg_canvas_t *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.m_canvas);
  }
  return bVar1;
}

Assistant:

bool SVGPatternElement::applyPaint(SVGRenderState& state, float opacity) const
{
    if(state.hasCycleReference(this))
        return false;
    auto attributes = collectPatternAttributes();
    auto patternContentElement = attributes.patternContentElement();
    if(patternContentElement == nullptr)
        return false;
    LengthContext lengthContext(this, attributes.patternUnits());
    Rect patternRect = {
        lengthContext.valueForLength(attributes.x()),
        lengthContext.valueForLength(attributes.y()),
        lengthContext.valueForLength(attributes.width()),
        lengthContext.valueForLength(attributes.height())
    };

    if(attributes.patternUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternRect.x = patternRect.x * bbox.w + bbox.x;
        patternRect.y = patternRect.y * bbox.h + bbox.y;
        patternRect.w = patternRect.w * bbox.w;
        patternRect.h = patternRect.h * bbox.h;
    }

    auto currentTransform = attributes.patternTransform() * state.currentTransform();
    auto xScale = currentTransform.xScale();
    auto yScale = currentTransform.yScale();

    auto patternImage = Canvas::create(0, 0, patternRect.w * xScale, patternRect.h * yScale);
    auto patternImageTransform = Transform::scaled(xScale, yScale);

    const auto& viewBoxRect = attributes.viewBox();
    if(viewBoxRect.isValid()) {
        const auto& preserveAspectRatio = attributes.preserveAspectRatio();
        patternImageTransform.multiply(preserveAspectRatio.getTransform(viewBoxRect, patternRect.size()));
    } else if(attributes.patternContentUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternImageTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, patternImageTransform, SVGRenderMode::Painting, patternImage);
    patternContentElement->renderChildren(newState);

    auto patternTransform = attributes.patternTransform();
    patternTransform.translate(patternRect.x, patternRect.y);
    patternTransform.scale(1.f / xScale, 1.f / yScale);
    state->setTexture(*patternImage, TextureType::Tiled, opacity, patternTransform);
    return true;
}